

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall
Catch::SonarQubeReporter::writeAssertion
          (SonarQubeReporter *this,AssertionStats *stats,bool okToFail)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  ostream *poVar3;
  pointer pMVar4;
  StringRef attribute;
  StringRef text;
  bool bVar5;
  uint uVar6;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar7;
  size_t sVar8;
  char *pcVar9;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar10;
  StringRef name;
  ReusableStringStream textRss;
  string elementName;
  ReusableStringStream messageRss;
  ScopedElement e;
  char local_a1;
  string local_a0;
  ReusableStringStream local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ReusableStringStream local_50;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar2 != ExplicitSkip) &&
     (((byte)OVar2 >> 4 & ((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)
      == 0)) {
    return;
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  pcVar9 = "skipped";
  if (!okToFail) {
    if (OVar2 < Exception) {
      uVar6 = OVar2 + Info;
      if (0x13 < uVar6) goto LAB_0013fd91;
      if ((0x2000fU >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0xc0000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_0013fd76;
        if (uVar6 != 5) goto LAB_0013fd91;
      }
      else {
LAB_0013fd24:
        pcVar9 = "internalError";
      }
    }
    else {
      pcVar9 = "error";
      if (OVar2 < DidntThrowException) {
        if (OVar2 == Exception) goto LAB_0013fd24;
        if (OVar2 != ThrewException) goto LAB_0013fd91;
      }
      else if (OVar2 != FatalErrorCondition) {
        if (OVar2 != DidntThrowException) goto LAB_0013fd91;
LAB_0013fd76:
        pcVar9 = "failure";
      }
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar9);
LAB_0013fd91:
  this_00 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_70);
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar8 = StringStreams::add(&pSVar7->super_StringStreams);
  local_50.m_index = sVar8;
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar3 = (ostream *)
           (pSVar7->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar8].m_ptr;
  local_50.m_oss = poVar3;
  std::ostream::write((char *)poVar3,(long)(stats->assertionResult).m_info.macroName.m_start);
  local_a0._M_dataplus._M_p._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_a0,1);
  AssertionResult::getExpression_abi_cxx11_(&local_a0,&stats->assertionResult);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0._M_string_length);
  local_80.m_index = CONCAT71(local_80.m_index._1_7_,0x29);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_80,1);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                    local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  attribute.m_start._1_7_ = local_a0._M_dataplus._M_p._1_7_;
  attribute.m_start._0_1_ = local_a0._M_dataplus._M_p._0_1_;
  attribute.m_size = local_a0._M_string_length;
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(this_00,name,attribute);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                    local_a0.field_2._M_allocated_capacity + 1);
  }
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar8 = StringStreams::add(&pSVar7->super_StringStreams);
  local_80.m_index = sVar8;
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar3 = (ostream *)
           (pSVar7->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar8].m_ptr;
  local_80.m_oss = poVar3;
  if ((stats->assertionResult).m_resultData.resultType == ExplicitSkip) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"SKIPPED\n",8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"FAILED:\n",8);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      local_a0._M_dataplus._M_p._0_1_ = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_a0,1);
      AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a0,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                         local_a0._M_dataplus._M_p._0_1_),local_a0._M_string_length)
      ;
      local_a1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_a1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                        local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar5 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"with expansion:\n\t",0x11);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_a0,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                         local_a0._M_dataplus._M_p._0_1_),local_a0._M_string_length)
      ;
      local_a1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_a1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                        local_a0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((stats->assertionResult).m_resultData.message._M_string_length != 0) {
    std::ostream::write((char *)poVar3,
                        (long)(stats->assertionResult).m_resultData.message._M_dataplus._M_p);
    local_a0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_a0,1);
  }
  pMVar10 = (stats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar4 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar10 != pMVar4) {
    do {
      if (pMVar10->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(pMVar10->message)._M_dataplus._M_p,(pMVar10->message)._M_string_length);
        local_a0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_a0,1);
      }
      pMVar10 = pMVar10 + 1;
    } while (pMVar10 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"at ",3);
  pcVar9 = (stats->assertionResult).m_info.lineInfo.file;
  local_a0._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  local_a0._M_dataplus._M_p._0_1_ = SUB81(pcVar9,0);
  local_a0._M_dataplus._M_p._1_7_ = (undefined7)((ulong)pcVar9 >> 8);
  operator<<(poVar3,(SourceLineInfo *)&local_a0);
  std::__cxx11::stringbuf::str();
  text.m_start._1_7_ = local_a0._M_dataplus._M_p._1_7_;
  text.m_start._0_1_ = local_a0._M_dataplus._M_p._0_1_;
  text.m_size = local_a0._M_string_length;
  XmlWriter::writeText(this_00,text,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
      &local_a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                    local_a0.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_80);
  ReusableStringStream::~ReusableStringStream(&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void SonarQubeReporter::writeAssertion(AssertionStats const& stats, bool okToFail) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            if (okToFail) {
                elementName = "skipped";
            } else {
                switch (result.getResultType()) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                    // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
                }
            }

            XmlWriter::ScopedElement e = xml.scopedElement(elementName);

            ReusableStringStream messageRss;
            messageRss << result.getTestMacroName() << '(' << result.getExpression() << ')';
            xml.writeAttribute("message"_sr, messageRss.str());

            ReusableStringStream textRss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                textRss << "SKIPPED\n";
            } else {
                textRss << "FAILED:\n";
                if (result.hasExpression()) {
                    textRss << '\t' << result.getExpressionInMacro() << '\n';
                }
                if (result.hasExpandedExpression()) {
                    textRss << "with expansion:\n\t" << result.getExpandedExpression() << '\n';
                }
            }

            if (result.hasMessage())
                textRss << result.getMessage() << '\n';

            for (auto const& msg : stats.infoMessages)
                if (msg.type == ResultWas::Info)
                    textRss << msg.message << '\n';

            textRss << "at " << result.getSourceInfo();
            xml.writeText(textRss.str(), XmlFormatting::Newline);
        }
    }